

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImgDisplay * __thiscall
cimg_library::CImgDisplay::resize(CImgDisplay *this,int nwidth,int nheight,bool force_redraw)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  X11_info *pXVar4;
  undefined1 in_CL;
  uint in_EDX;
  uint in_ESI;
  CImgDisplay *in_RDI;
  uint pixel_type_2;
  unsigned_short pixel_type_1;
  uchar pixel_type;
  uint dimy;
  uint dimx;
  uint tmpdimy;
  uint tmpdimx;
  Display *dpy;
  uint in_stack_ffffffffffffffa4;
  uint local_50;
  uint local_4c;
  undefined4 in_stack_ffffffffffffffc0;
  undefined2 uVar5;
  uint in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint uVar6;
  uint in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  CImgDisplay *in_stack_ffffffffffffffd8;
  Display *pDVar7;
  undefined1 in_stack_ffffffffffffffe3;
  undefined3 in_stack_ffffffffffffffe4;
  uint ndimy;
  CImgDisplay *this_00;
  CImgDisplay *local_8;
  
  uVar5 = (undefined2)((uint)in_stack_ffffffffffffffc0 >> 0x10);
  ndimy = CONCAT13(in_CL,in_stack_ffffffffffffffe4) & 0x1ffffff;
  if (((in_ESI == 0) || (in_EDX == 0)) ||
     ((this_00 = in_RDI, bVar1 = is_empty(in_RDI), bVar1 && (((int)in_ESI < 0 || ((int)in_EDX < 0)))
      ))) {
    local_8 = assign((CImgDisplay *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  else {
    bVar1 = is_empty(in_RDI);
    if (bVar1) {
      local_8 = assign(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0
                       ,(char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       in_stack_ffffffffffffffc4,SUB21((ushort)uVar5 >> 8,0),SUB21(uVar5,0));
    }
    else {
      pXVar4 = cimg::X11_attr();
      pDVar7 = pXVar4->display;
      local_4c = in_ESI;
      if ((int)in_ESI < 1) {
        local_4c = (-in_ESI * in_RDI->_width) / 100;
      }
      local_50 = in_EDX;
      if ((int)in_EDX < 1) {
        local_50 = (-in_EDX * in_RDI->_height) / 100;
      }
      if (local_4c == 0) {
        local_4c = 1;
      }
      if (local_50 == 0) {
        local_50 = 1;
      }
      uVar3 = local_50;
      uVar6 = local_4c;
      XLockDisplay(pDVar7);
      if ((in_RDI->_window_width != uVar6) || (in_RDI->_window_height != uVar3)) {
        XResizeWindow(pDVar7,in_RDI->_window,uVar6,uVar3);
      }
      if ((in_RDI->_width != uVar6) || (in_RDI->_height != uVar3)) {
        pXVar4 = cimg::X11_attr();
        in_stack_ffffffffffffffa4 = pXVar4->nb_bits;
        if (in_stack_ffffffffffffffa4 == 8) {
          _resize<unsigned_char>
                    (this_00,(uchar)(in_ESI >> 0x18),in_EDX,ndimy,(bool)in_stack_ffffffffffffffe3);
        }
        else if (in_stack_ffffffffffffffa4 == 0x10) {
          _resize<unsigned_short>
                    (this_00,(unsigned_short)(in_ESI >> 0x10),in_EDX,ndimy,
                     (bool)in_stack_ffffffffffffffe3);
        }
        else {
          _resize<unsigned_int>(this_00,in_ESI,in_EDX,ndimy,(bool)in_stack_ffffffffffffffe3);
        }
      }
      in_RDI->_width = uVar6;
      in_RDI->_window_width = uVar6;
      in_RDI->_height = uVar3;
      in_RDI->_window_height = uVar3;
      in_RDI->_is_resized = false;
      XUnlockDisplay(pDVar7);
      if ((in_RDI->_is_fullscreen & 1U) != 0) {
        iVar2 = screen_width();
        uVar3 = iVar2 - in_RDI->_width >> 1;
        screen_height();
        move((CImgDisplay *)CONCAT44(local_4c,local_50),in_stack_ffffffffffffffa4,uVar3);
      }
      local_8 = in_RDI;
      if ((ndimy & 0x1000000) != 0) {
        local_8 = paint((CImgDisplay *)CONCAT44(local_4c,local_50),
                        SUB41(in_stack_ffffffffffffffa4 >> 0x18,0));
      }
    }
  }
  return local_8;
}

Assistant:

CImgDisplay& resize(const int nwidth, const int nheight, const bool force_redraw=true) {
      if (!nwidth || !nheight || (is_empty() && (nwidth<0 || nheight<0))) return assign();
      if (is_empty()) return assign(nwidth,nheight);
      Display *const dpy = cimg::X11_attr().display;
      const unsigned int
        tmpdimx = (nwidth>0)?nwidth:(-nwidth*_width/100),
        tmpdimy = (nheight>0)?nheight:(-nheight*_height/100),
        dimx = tmpdimx?tmpdimx:1,
        dimy = tmpdimy?tmpdimy:1;
      XLockDisplay(dpy);
      if (_window_width!=dimx || _window_height!=dimy) XResizeWindow(dpy,_window,dimx,dimy);
      if (_width!=dimx || _height!=dimy) switch (cimg::X11_attr().nb_bits) {
        case 8 :  { unsigned char pixel_type = 0; _resize(pixel_type,dimx,dimy,force_redraw); } break;
        case 16 : { unsigned short pixel_type = 0; _resize(pixel_type,dimx,dimy,force_redraw); } break;
        default : { unsigned int pixel_type = 0; _resize(pixel_type,dimx,dimy,force_redraw); }
        }
      _window_width = _width = dimx; _window_height = _height = dimy;
      _is_resized = false;
      XUnlockDisplay(dpy);
      if (_is_fullscreen) move((screen_width()-_width)/2,(screen_height()-_height)/2);
      if (force_redraw) return paint();
      return *this;
    }